

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceSwapFieldTest::FindFieldByName
          (NoFieldPresenceSwapFieldTest *this,string_view field_name)

{
  string_view name;
  FieldDescriptor **v1;
  FieldDescriptor **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  LogMessage local_70;
  Voidify local_59;
  Nullable<const_char_*> local_58;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  size_t local_48;
  FieldDescriptor *local_40;
  FieldDescriptor *f2;
  char *local_30;
  FieldDescriptor *local_28;
  FieldDescriptor *f1;
  NoFieldPresenceSwapFieldTest *this_local;
  string_view field_name_local;
  
  local_30 = field_name._M_str;
  f2 = (FieldDescriptor *)field_name._M_len;
  f1 = (FieldDescriptor *)this;
  this_local = (NoFieldPresenceSwapFieldTest *)f2;
  field_name_local._M_len = (size_t)local_30;
  local_28 = Descriptor::FindFieldByName(this->d1_,field_name);
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this_local;
  local_48 = field_name_local._M_len;
  name._M_str = (char *)field_name_local._M_len;
  name._M_len = (size_t)this_local;
  local_40 = Descriptor::FindFieldByName(this->d2_,name);
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FieldDescriptor_const*>(&local_28);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FieldDescriptor_const*>(&local_40);
  local_58 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
                       (v1,v2,"f1 == f2");
  if (local_58 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_58);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_test.cc"
               ,0x16b,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_70);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_59,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_70);
  }
  return local_28;
}

Assistant:

const FieldDescriptor* FindFieldByName(absl::string_view field_name) {
    const FieldDescriptor* f1 = d1_->FindFieldByName(field_name);
    const FieldDescriptor* f2 = d2_->FindFieldByName(field_name);

    // We actually ensure uniqueness of *field descriptors* even if we try to
    // obtain them from different *message descriptors*.
    ABSL_CHECK_EQ(f1, f2);
    return f1;
  }